

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::
token_matcher<pstore::exchange::import_ns::callbacks,_pstore::json::details::null_complete>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
           *__return_storage_ptr__,
          token_matcher<pstore::exchange::import_ns::callbacks,_pstore::json::details::null_complete>
          *this,parser<pstore::exchange::import_ns::callbacks> *parser,maybe<char,_void> *ch)

{
  maybe<char,_void> *pmVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  error_code eVar5;
  void *local_78;
  error_code local_70;
  bool local_59;
  void *local_58;
  error_code local_50;
  error_code local_40;
  bool local_29;
  maybe<char,_void> *pmStack_28;
  bool match;
  maybe<char,_void> *ch_local;
  parser<pstore::exchange::import_ns::callbacks> *parser_local;
  token_matcher<pstore::exchange::import_ns::callbacks,_pstore::json::details::null_complete>
  *this_local;
  
  local_29 = true;
  pmStack_28 = ch;
  ch_local = (maybe<char,_void> *)parser;
  parser_local = (parser<pstore::exchange::import_ns::callbacks> *)this;
  this_local = (token_matcher<pstore::exchange::import_ns::callbacks,_pstore::json::details::null_complete>
                *)__return_storage_ptr__;
  iVar3 = matcher<pstore::exchange::import_ns::callbacks>::get_state
                    (&this->super_matcher<pstore::exchange::import_ns::callbacks>);
  if (iVar3 == 1) {
    assert_failed("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x1ad);
  }
  if (iVar3 == 2) {
    bVar2 = maybe::operator_cast_to_bool((maybe *)ch);
    if ((bVar2) && (pcVar4 = maybe<char,_void>::operator*(ch), *pcVar4 == *this->text_)) {
      this->text_ = this->text_ + 1;
      if (*this->text_ == '\0') {
        matcher<pstore::exchange::import_ns::callbacks>::set_state
                  (&this->super_matcher<pstore::exchange::import_ns::callbacks>,3);
      }
    }
    else {
      pmVar1 = ch_local;
      std::error_code::error_code<pstore::json::error_code,void>(&local_40,unrecognized_token);
      matcher<pstore::exchange::import_ns::callbacks>::set_error
                (&this->super_matcher<pstore::exchange::import_ns::callbacks>,
                 (parser<pstore::exchange::import_ns::callbacks> *)pmVar1,&local_40);
    }
  }
  else if (iVar3 == 3) {
    bVar2 = maybe::operator_cast_to_bool((maybe *)ch);
    if (bVar2) {
      pcVar4 = maybe<char,_void>::operator*(ch);
      iVar3 = isalnum((int)*pcVar4);
      pmVar1 = ch_local;
      if (iVar3 != 0) {
        std::error_code::error_code<pstore::json::error_code,void>(&local_50,unrecognized_token);
        matcher<pstore::exchange::import_ns::callbacks>::set_error
                  (&this->super_matcher<pstore::exchange::import_ns::callbacks>,
                   (parser<pstore::exchange::import_ns::callbacks> *)pmVar1,&local_50);
        local_58 = (void *)0x0;
        local_59 = true;
        std::
        pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
        ::pair<std::nullptr_t,_bool,_true>(__return_storage_ptr__,&local_58,&local_59);
        return __return_storage_ptr__;
      }
      local_29 = false;
    }
    pmVar1 = ch_local;
    eVar5 = null_complete::operator()
                      ((null_complete *)&this->field_0x18,
                       (parser<pstore::exchange::import_ns::callbacks> *)ch_local);
    local_70._M_cat = eVar5._M_cat;
    local_70._M_value = eVar5._M_value;
    matcher<pstore::exchange::import_ns::callbacks>::set_error
              (&this->super_matcher<pstore::exchange::import_ns::callbacks>,
               (parser<pstore::exchange::import_ns::callbacks> *)pmVar1,&local_70);
    matcher<pstore::exchange::import_ns::callbacks>::set_state
              (&this->super_matcher<pstore::exchange::import_ns::callbacks>,1);
  }
  local_78 = (void *)0x0;
  std::
  pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
  ::pair<std::nullptr_t,_bool_&,_true>(__return_storage_ptr__,&local_78,&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            token_matcher<Callbacks, DoneFunction>::consume (parser<Callbacks> & parser,
                                                             maybe<char> ch) {
                bool match = true;
                switch (this->get_state ()) {
                case start_state:
                    if (!ch || *ch != *text_) {
                        this->set_error (parser, error_code::unrecognized_token);
                    } else {
                        ++text_;
                        if (*text_ == '\0') {
                            // We've run out of input text, so ensure that the next character isn't
                            // alpha-numeric.
                            this->set_state (last_state);
                        }
                    }
                    break;
                case last_state:
                    if (ch) {
                        if (std::isalnum (*ch) != 0) {
                            this->set_error (parser, error_code::unrecognized_token);
                            return {nullptr, true};
                        }
                        match = false;
                    }
                    this->set_error (parser, done_ (parser));
                    this->set_state (done_state);
                    break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                return {nullptr, match};
            }